

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O0

send_result_t
zmq::send_multipart<std::vector<zmq::message_t,std::allocator<zmq::message_t>>&,void>
          (socket_ref s,vector<zmq::message_t,_std::allocator<zmq::message_t>_> *msgs,
          send_flags flags)

{
  bool bVar1;
  reference pmVar2;
  size_t in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  send_flags b;
  int in_R8D;
  send_result_t sVar4;
  __normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
  local_78;
  ssize_t local_70 [2];
  send_flags local_5c;
  message_t *pmStack_58;
  send_flags msg_flags;
  __normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
  local_50;
  __normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
  next;
  size_t msg_count;
  iterator end_it;
  iterator it;
  send_flags flags_local;
  vector<zmq::message_t,_std::allocator<zmq::message_t>_> *msgs_local;
  socket_ref s_local;
  bool local_10;
  
  msgs_local = (vector<zmq::message_t,_std::allocator<zmq::message_t>_> *)
               s.super_socket_base._handle;
  end_it = std::begin<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>(msgs);
  msg_count = (size_t)std::end<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>(msgs);
  next._M_current = (message_t *)0x0;
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&end_it,(__normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
                                *)&msg_count);
    if (!bVar1) {
      std::optional<unsigned_long>::optional<unsigned_long,_true>
                ((optional<unsigned_long> *)&s_local,(unsigned_long *)&next);
      uVar3 = extraout_RDX_00;
LAB_0017bc47:
      sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar3 >> 8);
      sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged = local_10;
      sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)s_local.super_socket_base._handle;
      return (send_result_t)
             sVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>;
    }
    pmStack_58 = end_it._M_current;
    local_50 = std::
               next<__gnu_cxx::__normal_iterator<zmq::message_t*,std::vector<zmq::message_t,std::allocator<zmq::message_t>>>>
                         ((__normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
                           )end_it._M_current,1);
    bVar1 = __gnu_cxx::operator==
                      (&local_50,
                       (__normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
                        *)&msg_count);
    in_RCX = CONCAT71((int7)(in_RCX >> 8),bVar1);
    b = sndmore;
    if (bVar1) {
      b = none;
    }
    local_5c = operator|(flags,b);
    pmVar2 = __gnu_cxx::
             __normal_iterator<zmq::message_t_*,_std::vector<zmq::message_t,_std::allocator<zmq::message_t>_>_>
             ::operator*(&end_it);
    local_70[0] = detail::socket_base::send
                            ((socket_base *)&msgs_local,(int)pmVar2,(void *)(ulong)local_5c,in_RCX,
                             in_R8D);
    bVar1 = std::optional::operator_cast_to_bool((optional *)local_70);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      local_78._M_current =
           (message_t *)std::begin<std::vector<zmq::message_t,std::allocator<zmq::message_t>>>(msgs)
      ;
      bVar1 = __gnu_cxx::operator==(&end_it,&local_78);
      if (!bVar1) {
        __assert_fail("it == begin(msgs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zeromq[P]cppzmq/zmq_addon.hpp"
                      ,0xf1,
                      "send_result_t zmq::send_multipart(socket_ref, Range &&, send_flags) [Range = std::vector<zmq::message_t> &]"
                     );
      }
      std::optional<unsigned_long>::optional((optional<unsigned_long> *)&s_local);
      uVar3 = extraout_RDX;
      goto LAB_0017bc47;
    }
    next._M_current = (message_t *)(((next._M_current)->msg)._ + 1);
    end_it._M_current = local_50._M_current;
  } while( true );
}

Assistant:

send_result_t
send_multipart(socket_ref s, Range &&msgs, send_flags flags = send_flags::none)
{
    using std::begin;
    using std::end;
    auto it = begin(msgs);
    const auto end_it = end(msgs);
    size_t msg_count = 0;
    while (it != end_it) {
        const auto next = std::next(it);
        const auto msg_flags =
          flags | (next == end_it ? send_flags::none : send_flags::sndmore);
        if (!s.send(*it, msg_flags)) {
            // zmq ensures atomic delivery of messages
            assert(it == begin(msgs));
            return {};
        }
        ++msg_count;
        it = next;
    }
    return msg_count;
}